

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:550:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:550:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  long *plVar2;
  object_ptr *e;
  value *item;
  pointer e_00;
  anon_class_8_1_2a3436f3 add_object;
  object_ptr a;
  uint32_t n;
  anon_class_24_3_4e94b03e add_value;
  anon_class_8_1_2a3436f3 local_88;
  gc_heap_ptr_untyped local_80;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  uint32_t local_4c;
  anon_class_24_3_4e94b03e local_48;
  
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_80,(gc_heap_ptr_untyped *)&this->f);
  make_array((gc_heap_ptr<mjs::global_object> *)&local_60,(uint32_t)&local_80);
  local_48.n = &local_4c;
  local_4c = 0;
  local_88.add_value = &local_48;
  local_48.h = local_80.heap_;
  local_48.a = (object_ptr *)&local_60;
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_80);
  (**(code **)(*plVar2 + 0x88))(&local_70,plVar2,this_);
  anon_unknown_110::array_concat::anon_class_8_1_2a3436f3::operator()
            (&local_88,(object_ptr *)&local_70);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (e_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
              super__Vector_impl_data._M_start; e_00 != pvVar1; e_00 = e_00 + 1) {
    if (e_00->type_ == object) {
      e = value::object_value(e_00);
      anon_unknown_110::array_concat::anon_class_8_1_2a3436f3::operator()(&local_88,e);
    }
    else {
      anon_unknown_110::array_concat::anon_class_24_3_4e94b03e::operator()(&local_48,e_00);
    }
  }
  value::value(__return_storage_ptr__,(object_ptr *)&local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }